

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scfx_rep.cpp
# Opt level: O3

scfx_rep * sc_dt::div_scfx_rep(scfx_rep *lhs,scfx_rep *rhs,int div_wl)

{
  uint *puVar1;
  state sVar2;
  state sVar3;
  word *pwVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  scfx_rep *this;
  word *pwVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  scfx_rep_node *node;
  int iVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  scfx_rep remainder;
  scfx_index x;
  scfx_rep local_68;
  long local_40;
  scfx_index local_38;
  
  this = (scfx_rep *)scfx_rep::operator_new((scfx_rep *)0x28,(size_t)rhs);
  scfx_rep::scfx_rep(this);
  sVar2 = lhs->m_state;
  if ((sVar2 == not_a_number) || (sVar3 = rhs->m_state, sVar3 == not_a_number)) {
LAB_001c160e:
    if ((this->m_mant).m_size != 4) {
      if ((this->m_mant).m_array == (word *)0x0) {
        (this->m_mant).m_size = 4;
        pwVar8 = scfx_mant::alloc_word(4);
        (this->m_mant).m_array = pwVar8;
      }
      else {
        pwVar8 = scfx_mant::alloc_word(4);
        scfx_mant::free_word((this->m_mant).m_array,(long)(this->m_mant).m_size);
        (this->m_mant).m_array = pwVar8;
        (this->m_mant).m_size = 4;
      }
    }
    this->m_state = not_a_number;
    return this;
  }
  if (sVar2 != normal) {
    if (sVar2 == infinity) {
      if (sVar3 == infinity) goto LAB_001c160e;
      goto LAB_001c1756;
    }
    bVar5 = false;
    goto LAB_001c16cb;
  }
  lVar12 = (long)(lhs->m_mant).m_size;
  if (0 < lVar12) {
    lVar15 = 0;
    do {
      if ((lhs->m_mant).m_array[lVar15] != 0) goto LAB_001c16c9;
      lVar15 = lVar15 + 1;
    } while (lVar12 != lVar15);
  }
  if (sVar3 == normal) {
    lVar12 = (long)(rhs->m_mant).m_size;
    if (0 < lVar12) {
      lVar15 = 0;
      do {
        if ((rhs->m_mant).m_array[lVar15] != 0) goto LAB_001c16c9;
        lVar15 = lVar15 + 1;
      } while (lVar12 != lVar15);
    }
    goto LAB_001c160e;
  }
LAB_001c16d3:
  lVar12 = (long)(lhs->m_mant).m_size;
  if (0 < lVar12) {
    lVar15 = 0;
    do {
      if ((lhs->m_mant).m_array[lVar15] != 0) goto LAB_001c16f2;
      lVar15 = lVar15 + 1;
    } while (lVar12 != lVar15);
  }
LAB_001c16fb:
  iVar10 = rhs->m_sign;
  iVar14 = lhs->m_sign;
  if (0 < (this->m_mant).m_size) {
    pwVar8 = (this->m_mant).m_array;
    lVar12 = 0;
    do {
      pwVar8[lVar12] = 0;
      lVar12 = lVar12 + 1;
    } while (lVar12 < (this->m_mant).m_size);
  }
  this->m_lsw = 0;
  this->m_wp = 0;
  this->m_sign = iVar10 * iVar14;
  this->m_state = normal;
  this->m_msw = 0;
  return this;
LAB_001c16c9:
  bVar5 = true;
LAB_001c16cb:
  if (sVar3 == normal) {
    lVar12 = (long)(rhs->m_mant).m_size;
    if (0 < lVar12) {
      lVar15 = 0;
      do {
        if ((rhs->m_mant).m_array[lVar15] != 0) goto LAB_001c16cf;
        lVar15 = lVar15 + 1;
      } while (lVar12 != lVar15);
    }
LAB_001c1756:
    iVar10 = rhs->m_sign;
    iVar14 = lhs->m_sign;
    if ((this->m_mant).m_size != 4) {
      if ((this->m_mant).m_array == (word *)0x0) {
        (this->m_mant).m_size = 4;
        pwVar8 = scfx_mant::alloc_word(4);
        (this->m_mant).m_array = pwVar8;
      }
      else {
        pwVar8 = scfx_mant::alloc_word(4);
        scfx_mant::free_word((this->m_mant).m_array,(long)(this->m_mant).m_size);
        (this->m_mant).m_array = pwVar8;
        (this->m_mant).m_size = 4;
      }
    }
    this->m_state = infinity;
    this->m_sign = iVar10 * iVar14;
    return this;
  }
LAB_001c16cf:
  if (!bVar5) {
LAB_001c16f2:
    if (sVar3 != infinity) {
      iVar10 = div_wl + 0x3f;
      if (-1 < div_wl + 0x20) {
        iVar10 = div_wl + 0x20;
      }
      iVar14 = 3;
      if (3 < iVar10 >> 5) {
        iVar14 = iVar10 >> 5;
      }
      scfx_rep::resize_to(this,iVar14 + 1,0);
      if (0 < (this->m_mant).m_size) {
        pwVar8 = (this->m_mant).m_array;
        lVar12 = 0;
        do {
          pwVar8[lVar12] = 0;
          lVar12 = lVar12 + 1;
        } while (lVar12 < (this->m_mant).m_size);
      }
      this->m_sign = rhs->m_sign * lhs->m_sign;
      iVar6 = scfx_find_msb((ulong)(lhs->m_mant).m_array[lhs->m_msw]);
      iVar10 = lhs->m_msw;
      iVar14 = lhs->m_wp;
      iVar7 = scfx_find_msb((ulong)(rhs->m_mant).m_array[rhs->m_msw]);
      iVar10 = ((rhs->m_wp - rhs->m_msw) + (iVar10 - iVar14)) * 0x20;
      uVar13 = (iVar6 - iVar7) + iVar10;
      uVar11 = (iVar6 - iVar7) + 0x1f + iVar10;
      if (-1 < (int)uVar13) {
        uVar11 = uVar13;
      }
      uVar13 = uVar13 - (uVar11 & 0xffffffe0);
      iVar10 = ((int)~uVar13 >> 0x1f) + (this->m_mant).m_size;
      this->m_wp = iVar10 - ((int)uVar11 >> 5);
      scfx_rep::scfx_rep(&local_68,lhs);
      scfx_rep::lshift(&local_68,-uVar13);
      if (local_68.m_msw == local_68.m_mant.m_size + -1) {
        scfx_rep::resize_to(&local_68,local_68.m_mant.m_size + 1,1);
      }
      iVar14 = rhs->m_msw - local_68.m_msw;
      if (iVar14 != 0 && local_68.m_msw <= rhs->m_msw) {
        scfx_rep::resize_to(&local_68,iVar14 + local_68.m_mant.m_size,-1);
      }
      pwVar8 = local_68.m_mant.m_array;
      iVar14 = iVar10 * 0x20 + uVar13;
      for (iVar10 = div_wl + 1; iVar10 != 0; iVar10 = iVar10 + -1) {
        if (local_68.m_state == normal) {
          if ((long)local_68.m_mant.m_size < 1) goto LAB_001c1a99;
          lVar12 = 0;
          while (pwVar8[lVar12] == 0) {
            lVar12 = lVar12 + 1;
            if (local_68.m_mant.m_size == lVar12) goto LAB_001c1a99;
          }
        }
        iVar6 = compare_msw_ff(rhs,&local_68);
        if (iVar6 < 1) {
          puVar1 = (this->m_mant).m_array + (iVar14 >> 5);
          *puVar1 = *puVar1 | 1 << ((byte)iVar14 & 0x1f);
          local_40 = (long)local_68.m_msw;
          iVar6 = rhs->m_lsw;
          iVar7 = rhs->m_msw - iVar6;
          iVar16 = local_68.m_msw - iVar7;
          pwVar4 = (rhs->m_mant).m_array;
          lVar12 = 0;
          uVar11 = 0;
          do {
            uVar17 = uVar11;
            uVar13 = local_68.m_mant.m_array[iVar16 + lVar12];
            uVar11 = pwVar4[iVar6 + lVar12];
            uVar18 = uVar11 + uVar17;
            local_68.m_mant.m_array[iVar16 + lVar12] = uVar13 - uVar18;
            lVar12 = lVar12 + 1;
            uVar11 = (uint)CARRY4(uVar11,uVar17) + (uint)(uVar13 < uVar18);
          } while (iVar7 + 1 != (int)lVar12);
          if ((uVar18 < uVar17) || (uVar13 < uVar18)) {
            local_68.m_mant.m_array[local_40 + 1] = 0;
          }
        }
        if (1 < (long)local_68.m_mant.m_size) {
          uVar9 = (long)local_68.m_mant.m_size + 1;
          do {
            pwVar8[uVar9 - 2] = pwVar8[uVar9 - 2] << 1 | pwVar8[uVar9 - 3] >> 0x1f;
            uVar9 = uVar9 - 1;
          } while (2 < uVar9);
        }
        *pwVar8 = *pwVar8 << 1;
        local_68.m_lsw = 0;
        if (0 < (long)local_68.m_mant.m_size) {
          lVar12 = 0;
          do {
            if (pwVar8[lVar12] != 0) {
              local_68.m_lsw = (int)lVar12;
              break;
            }
            lVar12 = lVar12 + 1;
          } while (local_68.m_mant.m_size != lVar12);
        }
        iVar14 = iVar14 + -1;
      }
      iVar10 = this->m_wp;
      iVar14 = iVar14 + iVar10 * -0x20;
      uVar11 = iVar14 + 1;
      uVar13 = iVar14 + 0x20;
      if (-1 < (int)uVar11) {
        uVar13 = uVar11;
      }
      uVar17 = (iVar14 - (uVar13 & 0xffffffe0)) + 1;
      iVar6 = ((int)uVar13 >> 5) + iVar10 + ((int)uVar17 >> 0x1f);
      local_38 = (scfx_index)(CONCAT44(uVar17,iVar6) & 0x1fffffffff);
      pwVar8 = (this->m_mant).m_array;
      if ((pwVar8[iVar6] >> (uVar17 & 0x1f) & 1) != 0) {
        uVar13 = iVar14 + 0x21;
        if (-1 < (int)(iVar14 + 2U)) {
          uVar13 = iVar14 + 2U;
        }
        uVar11 = (uVar11 - (uVar13 & 0xffffffe0)) + 1;
        if ((pwVar8[((int)uVar13 >> 5) + iVar10 + ((int)uVar11 >> 0x1f)] >> (uVar11 & 0x1f) & 1) !=
            0) {
          scfx_rep::q_incr(this,&local_38);
        }
      }
      this->m_r_flag = true;
LAB_001c1a99:
      scfx_rep::find_sw(this);
      if (local_68.m_mant.m_array == (word *)0x0) {
        return this;
      }
      scfx_mant::free_word(local_68.m_mant.m_array,(long)local_68.m_mant.m_size);
      return this;
    }
    goto LAB_001c16fb;
  }
  goto LAB_001c16d3;
}

Assistant:

scfx_rep*
div_scfx_rep( const scfx_rep& lhs, const scfx_rep& rhs, int div_wl )
{
    scfx_rep& result = *new scfx_rep;

    //
    // check for special cases
    //

    if( lhs.is_nan() || rhs.is_nan() || (lhs.is_inf() && rhs.is_inf()) ||
	(lhs.is_zero() && rhs.is_zero()) )
    {
	result.set_nan();
	return &result;
    }

    if( lhs.is_inf() || rhs.is_zero() )
    {
	result.set_inf( lhs.m_sign * rhs.m_sign );
	return &result;
    }

    if( lhs.is_zero() || rhs.is_inf() )
    {
	result.set_zero( lhs.m_sign * rhs.m_sign );
	return &result;
    }

    //
    // do it
    //

    // compute one bit more for rounding
    div_wl ++;

    result.resize_to( sc_max( n_word( div_wl ) + 1, min_mant ) );
    result.m_mant.clear();
    result.m_sign = lhs.m_sign * rhs.m_sign;

    int msb_lhs = scfx_find_msb( lhs.m_mant[lhs.m_msw] )
	        + ( lhs.m_msw - lhs.m_wp ) * bits_in_word;
    int msb_rhs = scfx_find_msb( rhs.m_mant[rhs.m_msw] )
	        + ( rhs.m_msw - rhs.m_wp ) * bits_in_word;

    int msb_res = msb_lhs - msb_rhs;
    int to_shift = -msb_res % bits_in_word;
    int result_index;

    int c = ( msb_res % bits_in_word >= 0 ) ? 1 : 0;

    result_index = (result.size() - c) * bits_in_word + msb_res % bits_in_word;
    result.m_wp   = (result.size() - c) - msb_res / bits_in_word;

    scfx_rep remainder = lhs;

    // align msb from remainder to msb from rhs
    remainder.lshift( to_shift );

    // make sure msw( remainder ) < size - 1
    if( remainder.m_msw == remainder.size() - 1 )
	remainder.resize_to( remainder.size() + 1, 1 );

    // make sure msw( remainder ) >= msw( rhs )!
    int msw_diff = rhs.m_msw - remainder.m_msw;
    if (msw_diff > 0)
	remainder.resize_to( remainder.size() + msw_diff, -1 );

    int counter;

    for( counter = div_wl; counter && ! remainder.is_zero(); counter -- )
    {
	if( compare_msw_ff( rhs, remainder ) <= 0 )
	{
	    result.set_bin( result_index );
	    sub_with_index( remainder.m_mant, remainder.m_msw, remainder.m_lsw,
			    rhs.m_mant, rhs.m_msw, rhs.m_lsw );
	}
	result_index --;
	remainder.shift_left( 1 );
        remainder.m_lsw = remainder.find_lsw();
    }

    // perform convergent rounding, if needed
    if( counter == 0 )
    {
	int index = result_index + 1 - result.m_wp * bits_in_word;

	scfx_index x = result.calc_indices( index );
	scfx_index x1 = result.calc_indices( index + 1 );

	if( result.o_bit_at( x ) && result.o_bit_at( x1 ) )
	    result.q_incr( x );

	result.m_r_flag = true;
    }

    result.find_sw();

    return &result;
}